

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

int uv__udp_check_before_send(uv_udp_t *handle,sockaddr *addr)

{
  sa_family_t sVar1;
  int iVar2;
  
  iVar2 = -0x16;
  if (handle->type != UV_UDP) {
    return -0x16;
  }
  if (addr != (sockaddr *)0x0) {
    if ((handle->flags >> 0x19 & 1) == 0) {
      sVar1 = addr->sa_family;
      if (sVar1 != 1) {
        if (sVar1 == 2) {
          iVar2 = 0x10;
        }
        else if (sVar1 == 10) {
          return 0x1c;
        }
        return iVar2;
      }
      iVar2 = 0x6e;
    }
    else {
      iVar2 = -0x6a;
    }
    return iVar2;
  }
  iVar2 = -0x59;
  if ((handle->flags >> 0x19 & 1) != 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int uv__udp_check_before_send(uv_udp_t* handle, const struct sockaddr* addr) {
  unsigned int addrlen;

  if (handle->type != UV_UDP)
    return UV_EINVAL;

  if (addr != NULL && (handle->flags & UV_HANDLE_UDP_CONNECTED))
    return UV_EISCONN;

  if (addr == NULL && !(handle->flags & UV_HANDLE_UDP_CONNECTED))
    return UV_EDESTADDRREQ;

  if (addr != NULL) {
    if (addr->sa_family == AF_INET)
      addrlen = sizeof(struct sockaddr_in);
    else if (addr->sa_family == AF_INET6)
      addrlen = sizeof(struct sockaddr_in6);
#if defined(AF_UNIX) && !defined(_WIN32)
    else if (addr->sa_family == AF_UNIX)
      addrlen = sizeof(struct sockaddr_un);
#endif
    else
      return UV_EINVAL;
  } else {
    addrlen = 0;
  }

  return addrlen;
}